

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O1

vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> * xmrig::OclPlatform::get(void)

{
  vector<xmrig::OclPlatform,std::allocator<xmrig::OclPlatform>> *in_RDI;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> platforms;
  unsigned_long local_30;
  void *local_28;
  void *local_20;
  
  OclLib::getPlatformIDs();
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (local_28 != local_20) {
    std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::reserve
              ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)in_RDI,
               (long)local_20 - (long)local_28 >> 3);
    local_30 = 0;
    if (local_20 != local_28) {
      do {
        std::vector<xmrig::OclPlatform,std::allocator<xmrig::OclPlatform>>::
        emplace_back<unsigned_long&,_cl_platform_id*const&>
                  (in_RDI,&local_30,(_cl_platform_id **)((long)local_28 + local_30 * 8));
        local_30 = local_30 + 1;
      } while (local_30 < (ulong)((long)local_20 - (long)local_28 >> 3));
    }
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return (vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)in_RDI;
}

Assistant:

std::vector<xmrig::OclPlatform> xmrig::OclPlatform::get()
{
    const std::vector<cl_platform_id> platforms = OclLib::getPlatformIDs();
    std::vector<OclPlatform> out;
    if (platforms.empty()) {
        return out;
    }

    out.reserve(platforms.size());

    for (size_t i = 0; i < platforms.size(); i++) {
        out.emplace_back(i, platforms[i]);
    }

    return out;
}